

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCall1(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  InplaceStr name_00;
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  undefined1 local_e8 [12];
  char *local_d8;
  char *pcStack_d0;
  ArgumentData local_b8;
  undefined1 local_88 [8];
  SmallArray<ArgumentData,_1U> arguments;
  bool allowFastLookup_local;
  bool allowInternal_local;
  bool allowFailure_local;
  ExprBase *arg0_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  arguments.allocator._6_1_ = allowInternal;
  arguments.allocator._5_1_ = allowFastLookup;
  arguments.allocator._7_1_ = allowFailure;
  SmallArray<ArgumentData,_1U>::SmallArray((SmallArray<ArgumentData,_1U> *)local_88,ctx->allocator);
  ArgumentData::ArgumentData(&local_b8,arg0->source,false,(SynIdentifier *)0x0,arg0->type,arg0);
  SmallArray<ArgumentData,_1U>::push_back((SmallArray<ArgumentData,_1U> *)local_88,&local_b8);
  local_d8 = name.begin;
  pcStack_d0 = name.end;
  ArrayView<ArgumentData>::ArrayView<1u>
            ((ArrayView<ArgumentData> *)local_e8,(SmallArray<ArgumentData,_1U> *)local_88);
  name_00.end = pcStack_d0;
  name_00.begin = local_d8;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)local_e8._0_8_;
  arguments_00.count = local_e8._8_4_;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name_00,arguments_00,(bool)(arguments.allocator._7_1_ & 1),
                      (bool)(arguments.allocator._6_1_ & 1),(bool)(arguments.allocator._5_1_ & 1));
  SmallArray<ArgumentData,_1U>::~SmallArray((SmallArray<ArgumentData,_1U> *)local_88);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall1(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 1> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}